

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> * __thiscall
jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
as_string<std::allocator<wchar_t>>
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,
          basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> *this,
          allocator<wchar_t> *alloc)

{
  semantic_tag tag;
  system_error *this_00;
  string_view_type sVar1;
  string_view_type sVar2;
  error_code __ec;
  value_converter<jsoncons::byte_string_view,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>
  converter;
  error_code ec;
  basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
  encoder;
  allocator<char> local_1a9;
  string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_1a8;
  error_code local_1a0;
  basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
  local_190;
  
  local_1a0._M_value = 0;
  local_1a0._M_cat = (error_category *)std::_V2::system_category();
  local_1a8.buf_ptr = __return_storage_ptr__;
  switch((byte)*this & 0xf) {
  case 7:
  case 0xf:
    sVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                      ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
    sVar2 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                      ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>
              ((wstring *)__return_storage_ptr__,sVar1._M_str,sVar1._M_str + sVar2._M_len);
    break;
  case 8:
  case 9:
    as_string<std::allocator<wchar_t>>
              (__return_storage_ptr__,
               *(basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> **)(this + 8),
               alloc);
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
    basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
    ::basic_compact_json_encoder(&local_190,&local_1a8,&local_1a9);
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               &local_190.super_basic_json_visitor<wchar_t>);
    goto LAB_003fd4c6;
  case 0xc:
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_byte_string_view
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)&local_190);
    tag = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::tag
                    ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
    value_converter<jsoncons::byte_string_view,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>
    ::convert<wchar_t>(__return_storage_ptr__,
                       (value_converter<jsoncons::byte_string_view,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>
                        *)&local_1a8,(byte_string_view *)&local_190,tag,&local_1a0);
    if (local_1a0._M_value != 0) {
      this_00 = (system_error *)__cxa_allocate_exception(0x58);
      __ec._4_4_ = 0;
      __ec._M_value = local_1a0._M_value;
      *(undefined ***)(this_00 + 0x50) = &PTR__json_exception_00b58738;
      __ec._M_cat = local_1a0._M_cat;
      std::system_error::system_error(this_00,__ec);
      *(undefined8 *)this_00 = 0xb586d8;
      *(undefined8 *)(this_00 + 0x50) = 0xb58710;
      *(undefined8 *)(this_00 + 0x20) = 0;
      *(undefined8 *)(this_00 + 0x28) = 0;
      *(system_error **)(this_00 + 0x30) = this_00 + 0x40;
      *(undefined8 *)(this_00 + 0x38) = 0;
      this_00[0x40] = (system_error)0x0;
      __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
    }
    break;
  case 0xe:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
    basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
    ::basic_compact_json_encoder(&local_190,&local_1a8,&local_1a9);
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               &local_190.super_basic_json_visitor<wchar_t>);
LAB_003fd4c6:
    basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
    ::~basic_compact_json_encoder(&local_190);
  }
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<char_type,char_traits_type,SAllocator> as_string(const SAllocator& alloc) const 
        {
            using string_type2 = std::basic_string<char_type,char_traits_type,SAllocator>;

            std::error_code ec;
            switch (storage_kind())
            {
                case json_storage_kind::short_str:
                case json_storage_kind::long_str:
                {
                    return string_type2(as_string_view().data(),as_string_view().length(),alloc);
                }
                case json_storage_kind::byte_str:
                {
                    value_converter<byte_string_view,string_type2> converter;
                    auto s = converter.convert(as_byte_string_view(), tag(), ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        JSONCONS_THROW(ser_error(ec));
                    }
                    return s;
                }
                case json_storage_kind::array:
                {
                    string_type2 s(alloc);
                    {
                        basic_compact_json_encoder<char_type,jsoncons::string_sink<string_type2>> encoder(s);
                        dump(encoder);
                    }
                    return s;
                }
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().as_string(alloc);
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().as_string(alloc);
                default:
                {
                    string_type2 s(alloc);
                    basic_compact_json_encoder<char_type,jsoncons::string_sink<string_type2>> encoder(s);
                    dump(encoder);
                    return s;
                }
            }
        }